

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O0

Roaring64Map * __thiscall roaring::Roaring64Map::operator-(Roaring64Map *this,Roaring64Map *o)

{
  Roaring64Map *in_RDX;
  Roaring64Map *in_RDI;
  Roaring64Map *this_00;
  Roaring64Map *in_stack_ffffffffffffffe0;
  
  this_00 = in_RDI;
  Roaring64Map(in_RDI,in_RDI);
  operator-=(in_RDX,in_stack_ffffffffffffffe0);
  Roaring64Map(this_00,in_RDI);
  ~Roaring64Map((Roaring64Map *)0x116ea3);
  return this_00;
}

Assistant:

Roaring64Map operator-(const Roaring64Map &o) const {
        return Roaring64Map(*this) -= o;
    }